

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::clear(TestResultParser *this)

{
  TestResultParser *this_local;
  
  xml::Parser::clear(&this->m_xmlParser);
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::clear(&this->m_itemStack);
  this->m_result = (TestCaseResult *)0x0;
  this->m_state = STATE_NOT_INITIALIZED;
  this->m_logVersion = TESTLOGVERSION_LAST;
  this->m_curItemList = (List *)0x0;
  this->m_base64DecodeOffset = 0;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void TestResultParser::clear (void)
{
	m_xmlParser.clear();
	m_itemStack.clear();

	m_result				= DE_NULL;
	m_state					= STATE_NOT_INITIALIZED;
	m_logVersion			= TESTLOGVERSION_LAST;
	m_curItemList			= DE_NULL;
	m_base64DecodeOffset	= 0;
	m_curNumValue.clear();
}